

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_json_reader.c
# Opt level: O2

dtl_dv_t * dtl_json_load_bstr(uint8_t *pBegin,uint8_t *pEnd)

{
  uint8_t *puVar1;
  dtl_dv_t *dv;
  dtl_json_reader_t reader;
  dtl_json_reader_t local_80;
  
  dtl_json_reader_create(&local_80);
  local_80.eof = true;
  puVar1 = dtl_json_reader_parse_block(&local_80,pBegin,pEnd);
  if (puVar1 == pEnd) {
    dv = (local_80.data)->currentElem;
    if (dv != (dtl_dv_t *)0x0) {
      dtl_dv_inc_ref(dv);
    }
  }
  else {
    dv = (dtl_dv_t *)0x0;
  }
  dtl_json_reader_destroy(&local_80);
  return dv;
}

Assistant:

dtl_dv_t* dtl_json_load_bstr(const uint8_t *pBegin, const uint8_t *pEnd)
{
   dtl_dv_t *retval = (dtl_dv_t*) 0;
   const uint8_t *pResult;
   dtl_json_reader_t reader;
   dtl_json_reader_create(&reader);
   reader.eof = true;
   pResult = dtl_json_reader_parse_block(&reader, pBegin, pEnd);
   if (pResult == (const uint8_t*) pEnd)
   {
      if (reader.data->currentElem != 0)
      {
         retval = reader.data->currentElem;
         dtl_dv_inc_ref(reader.data->currentElem);
      }
      dtl_json_reader_destroy(&reader);
   }
   else
   {
      dtl_json_reader_destroy(&reader);
   }
   return retval;
}